

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn5s.hpp
# Opt level: O2

void __thiscall trng::yarn5s::split(yarn5s *this,uint s,uint n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong s_00;
  int iVar9;
  bool bVar10;
  int32_t a [5];
  int32_t b [25];
  
  s_00 = (ulong)s;
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)b,"invalid argument for trng::yarn5s::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)b);
    std::invalid_argument::~invalid_argument((invalid_argument *)b);
  }
  if (1 < s) {
    jump(this,(ulong)n + 1);
    iVar9 = (this->S).r[0];
    jump(this,s_00);
    iVar1 = (this->S).r[0];
    jump(this,s_00);
    iVar2 = (this->S).r[0];
    jump(this,s_00);
    iVar3 = (this->S).r[0];
    jump(this,s_00);
    iVar4 = (this->S).r[0];
    jump(this,s_00);
    iVar5 = (this->S).r[0];
    jump(this,s_00);
    iVar6 = (this->S).r[0];
    jump(this,s_00);
    iVar7 = (this->S).r[0];
    jump(this,s_00);
    iVar8 = (this->S).r[0];
    jump(this,s_00);
    a[4] = (this->S).r[0];
    a[0] = iVar5;
    a[1] = iVar6;
    a[2] = iVar7;
    a[3] = iVar8;
    b[0] = iVar4;
    b[1] = iVar3;
    b[2] = iVar2;
    b[3] = iVar1;
    b[4] = iVar9;
    b[5] = iVar5;
    b[6] = iVar4;
    b[7] = iVar3;
    b[8] = iVar2;
    b[9] = iVar1;
    b[10] = iVar6;
    b[0xb] = iVar5;
    b[0xc] = iVar4;
    b[0xd] = iVar3;
    b[0xe] = iVar2;
    b[0xf] = iVar7;
    b[0x10] = iVar6;
    b[0x11] = iVar5;
    b[0x12] = iVar4;
    b[0x13] = iVar3;
    b[0x14] = iVar8;
    b[0x15] = iVar7;
    b[0x16] = iVar6;
    b[0x17] = iVar5;
    b[0x18] = iVar4;
    int_math::gauss<5>(&b,&a,0x7fffa78f);
    *(ulong *)(this->P).a = CONCAT44(a[1],a[0]);
    *(ulong *)((this->P).a + 2) = CONCAT44(a[3],a[2]);
    (this->P).a[4] = a[4];
    (this->S).r[0] = iVar4;
    (this->S).r[1] = iVar3;
    (this->S).r[2] = iVar2;
    (this->S).r[3] = iVar1;
    (this->S).r[4] = iVar9;
    iVar9 = 5;
    while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
      backward(this);
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn5s::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn5s::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      jump(s);
      const int32_t q6{S.r[0]};
      jump(s);
      const int32_t q7{S.r[0]};
      jump(s);
      const int32_t q8{S.r[0]};
      jump(s);
      const int32_t q9{S.r[0]};
      int32_t a[5], b[25];
      a[0] = q5;
      b[0] = q4;
      b[1] = q3;
      b[2] = q2;
      b[3] = q1;
      b[4] = q0;
      a[1] = q6;
      b[5] = q5;
      b[6] = q4;
      b[7] = q3;
      b[8] = q2;
      b[9] = q1;
      a[2] = q7;
      b[10] = q6;
      b[11] = q5;
      b[12] = q4;
      b[13] = q3;
      b[14] = q2;
      a[3] = q8;
      b[15] = q7;
      b[16] = q6;
      b[17] = q5;
      b[18] = q4;
      b[19] = q3;
      a[4] = q9;
      b[20] = q8;
      b[21] = q7;
      b[22] = q6;
      b[23] = q5;
      b[24] = q4;
      int_math::gauss<5>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      P.a[3] = a[3];
      P.a[4] = a[4];
      S.r[0] = q4;
      S.r[1] = q3;
      S.r[2] = q2;
      S.r[3] = q1;
      S.r[4] = q0;
      for (int i{0}; i < 5; ++i)
        backward();
    }
  }